

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsIsConstructor(JsValueRef object,bool *isConstructor)

{
  anon_class_16_2_2d901f9c fn;
  JsErrorCode JVar1;
  bool *local_18;
  bool *isConstructor_local;
  JsValueRef object_local;
  
  fn.isConstructor = &local_18;
  fn.object = &isConstructor_local;
  local_18 = isConstructor;
  isConstructor_local = (bool *)object;
  JVar1 = ContextAPINoScriptWrapper_NoRecord<JsIsConstructor::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsIsConstructor(_In_ JsValueRef object, _Out_ bool *isConstructor)
{
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        PARAM_NOT_NULL(isConstructor);

        *isConstructor = Js::JavascriptOperators::IsConstructor(object);

        return JsNoError;
    });
}